

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  long *plVar2;
  pointer pbVar3;
  void *pvVar4;
  ulong uVar5;
  MatchResultListener *pMVar6;
  pointer pcVar7;
  ulong uVar8;
  pointer pcVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  char *sep;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  char *local_78;
  char *local_70;
  vector<char,_std::allocator<char>_> local_68;
  vector<char,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 0;
  local_38 = element_printouts;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_50,*(size_type *)matrix,(value_type *)&local_68,(allocator_type *)&local_78);
  local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68,*(size_type *)(matrix + 8),(value_type *)&local_78,
             (allocator_type *)&local_70);
  uVar11 = *(ulong *)matrix;
  if (uVar11 != 0) {
    uVar8 = *(ulong *)(matrix + 8);
    uVar5 = 0;
    do {
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        uVar11 = 0;
        do {
          bVar13 = *(char *)(uVar11 + uVar8 * uVar5 + *(long *)(matrix + 0x10)) == '\x01';
          local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5] =
               local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5] | bVar13;
          pbVar1 = (byte *)(CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar11);
          *pbVar1 = *pbVar1 | bVar13;
          uVar11 = uVar11 + 1;
          uVar8 = *(ulong *)(matrix + 8);
        } while (uVar11 < uVar8);
        uVar11 = *(ulong *)matrix;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar11);
  }
  uVar10 = *(uint *)this;
  bVar13 = true;
  if ((uVar10 & 1) != 0) {
    local_78 = "where the following matchers don\'t match any elements:\n";
    pcVar7 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,
                               local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._0_1_);
    bVar13 = true;
    if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish != pcVar7) {
      uVar11 = 0;
      pcVar9 = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pcVar7[uVar11] == '\0') {
          if (listener->stream_ != (ostream *)0x0) {
            pMVar6 = MatchResultListener::operator<<(listener,&local_78);
            pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [10])0x2962a5);
            if (pMVar6->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
            }
            MatchResultListener::operator<<(pMVar6,(char (*) [3])0x299094);
            plVar2 = *(long **)(*(long *)(this + 8) + uVar11 * 8);
            (**(code **)(*plVar2 + 0x10))(plVar2,listener->stream_);
            local_78 = ",\n";
            pcVar7 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_68.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_1_);
            pcVar9 = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          bVar13 = false;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)pcVar9 - (long)pcVar7));
      uVar10 = *(uint *)this;
    }
  }
  if ((uVar10 & 2) != 0) {
    local_78 = "where the following elements don\'t match any matchers:\n";
    local_70 = "\nand ";
    if (bVar13) {
      local_70 = "";
    }
    if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      lVar12 = 8;
      uVar11 = 0;
      pcVar7 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar9 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pcVar7[uVar11] == '\0') {
          if (listener->stream_ != (ostream *)0x0) {
            pMVar6 = MatchResultListener::operator<<(listener,&local_70);
            pMVar6 = MatchResultListener::operator<<(pMVar6,&local_78);
            pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [10])0x296066);
            if (pMVar6->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
            }
            pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [3])0x299094);
            if (pMVar6->stream_ != (ostream *)0x0) {
              pbVar3 = (local_38->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar6->stream_,*(char **)((long)pbVar3 + lVar12 + -8),
                         *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar12));
            }
            local_78 = ",\n";
            local_70 = "";
            pcVar7 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar9 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          bVar13 = false;
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x20;
      } while (uVar11 < (ulong)((long)pcVar9 - (long)pcVar7));
    }
  }
  pvVar4 = (void *)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar13;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}